

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setclosureroot(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *pSVar2;
  SQObject o;
  SQObjectPtr *c;
  SQChar *in_stack_ffffffffffffffc8;
  SQWeakRef *r;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  HSQUIRRELVM v_00;
  SQRESULT local_8;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  pSVar2 = stack_get(in_stack_ffffffffffffffd0,(SQInteger)in_stack_ffffffffffffffc8);
  v_00 = *(HSQUIRRELVM *)&pSVar2->super_SQObject;
  if ((pSVar1->super_SQObject)._type == OT_CLOSURE) {
    if ((int)v_00 == 0xa000020) {
      r = (pSVar1->super_SQObject)._unVal.pWeakRef;
      SQRefCounted::GetWeakRef((SQRefCounted *)v_00,(SQObjectType)((ulong)r >> 0x20));
      SQClosure::SetRoot((SQClosure *)v_00,r);
      SQVM::Pop((SQVM *)0x1090a5);
      local_8 = 0;
    }
    else {
      local_8 = sq_throwerror(v_00,in_stack_ffffffffffffffc8);
    }
  }
  else {
    local_8 = sq_throwerror(v_00,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_setclosureroot(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &c = stack_get(v,idx);
    SQObject o = stack_get(v, -1);
    if(!sq_isclosure(c)) return sq_throwerror(v, _SC("closure expected"));
    if(sq_istable(o)) {
        _closure(c)->SetRoot(_table(o)->GetWeakRef(OT_TABLE));
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}